

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins.c
# Opt level: O0

int nn_ins_bind(nn_ins_item *item,nn_ins_fn fn)

{
  int iVar1;
  nn_ins_item *pnVar2;
  char *pcVar3;
  char *pcVar4;
  nn_list_item *it_00;
  nn_ins_item *local_68;
  nn_epbase *local_48;
  nn_ins_item *citem;
  nn_ins_item *bitem;
  nn_list_item *it;
  nn_ins_fn fn_local;
  nn_ins_item *item_local;
  
  nn_mutex_lock(&self.sync);
  bitem = (nn_ins_item *)nn_list_begin(&self.bound);
  while( true ) {
    pnVar2 = (nn_ins_item *)nn_list_end(&self.bound);
    if (bitem == pnVar2) {
      it_00 = nn_list_end(&self.bound);
      nn_list_insert(&self.bound,&item->item,it_00);
      for (bitem = (nn_ins_item *)nn_list_begin(&self.connected);
          pnVar2 = (nn_ins_item *)nn_list_end(&self.connected), bitem != pnVar2;
          bitem = (nn_ins_item *)nn_list_next(&self.connected,(nn_list_item *)bitem)) {
        if (bitem == (nn_ins_item *)0x0) {
          local_68 = (nn_ins_item *)0x0;
        }
        else {
          local_68 = (nn_ins_item *)&bitem[-1].item.prev;
        }
        pcVar3 = nn_epbase_getaddr(&item->epbase);
        pcVar4 = nn_epbase_getaddr(&local_68->epbase);
        iVar1 = strncmp(pcVar3,pcVar4,0x80);
        if ((iVar1 == 0) && (iVar1 = nn_epbase_ispeer(&item->epbase,local_68->protocol), iVar1 != 0)
           ) {
          (*fn)(item,local_68);
        }
      }
      nn_mutex_unlock(&self.sync);
      return 0;
    }
    if (bitem == (nn_ins_item *)0x0) {
      local_48 = (nn_epbase *)0x0;
    }
    else {
      local_48 = (nn_epbase *)&bitem[-1].item.prev;
    }
    pcVar3 = nn_epbase_getaddr(&item->epbase);
    pcVar4 = nn_epbase_getaddr(local_48);
    iVar1 = strncmp(pcVar3,pcVar4,0x80);
    if (iVar1 == 0) break;
    bitem = (nn_ins_item *)nn_list_next(&self.bound,(nn_list_item *)bitem);
  }
  nn_mutex_unlock(&self.sync);
  return -0x62;
}

Assistant:

int nn_ins_bind (struct nn_ins_item *item, nn_ins_fn fn)
{
    struct nn_list_item *it;
    struct nn_ins_item *bitem;
    struct nn_ins_item *citem;

    nn_mutex_lock (&self.sync);

    /*  Check whether the endpoint isn't already bound. */
    /*  TODO:  This is an O(n) algorithm! */
    for (it = nn_list_begin (&self.bound); it != nn_list_end (&self.bound);
          it = nn_list_next (&self.bound, it)) {
        bitem = nn_cont (it, struct nn_ins_item, item);
        if (strncmp (nn_epbase_getaddr (&item->epbase),
              nn_epbase_getaddr (&bitem->epbase), NN_SOCKADDR_MAX) == 0) {
            nn_mutex_unlock (&self.sync);
            return -EADDRINUSE;
        }
    }

    /*  Insert the entry into the endpoint repository. */
    nn_list_insert (&self.bound, &item->item,
        nn_list_end (&self.bound));

    /*  During this process new pipes may be created. */
    for (it = nn_list_begin (&self.connected);
          it != nn_list_end (&self.connected);
          it = nn_list_next (&self.connected, it)) {
        citem = nn_cont (it, struct nn_ins_item, item);
        if (strncmp (nn_epbase_getaddr (&item->epbase),
              nn_epbase_getaddr (&citem->epbase), NN_SOCKADDR_MAX) == 0) {

            /*  Check whether the two sockets are compatible. */
            if (!nn_epbase_ispeer (&item->epbase, citem->protocol))
                continue;

            fn (item, citem);
        }
    }

    nn_mutex_unlock (&self.sync);

    return 0;
}